

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

uint8_t * JS_GetArrayBuffer(JSContext *ctx,size_t *psize,JSValue obj)

{
  JSValue obj_00;
  JSArrayBuffer *pJVar1;
  long *in_RSI;
  JSArrayBuffer *abuf;
  JSContext *local_40;
  JSValueUnion in_stack_ffffffffffffffd0;
  
  obj_00.tag = (int64_t)in_RSI;
  obj_00.u.float64 = in_stack_ffffffffffffffd0.float64;
  pJVar1 = js_get_array_buffer(local_40,obj_00);
  if (pJVar1 != (JSArrayBuffer *)0x0) {
    if (pJVar1->detached == '\0') {
      *in_RSI = (long)pJVar1->byte_length;
      return pJVar1->data;
    }
    JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x150e70);
  }
  *in_RSI = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *JS_GetArrayBuffer(JSContext *ctx, size_t *psize, JSValueConst obj)
{
    JSArrayBuffer *abuf = js_get_array_buffer(ctx, obj);
    if (!abuf)
        goto fail;
    if (abuf->detached) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    *psize = abuf->byte_length;
    return abuf->data;
 fail:
    *psize = 0;
    return NULL;
}